

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

int CVmObjBigNum::precision_from_string(char *str,size_t len,int radix)

{
  uint ch;
  int iVar1;
  wchar_t wVar2;
  ulong uVar3;
  uint uVar4;
  byte *p;
  byte *p_00;
  bool bVar5;
  double dVar6;
  double local_38;
  
  if (radix == 0) {
    radix = radix_from_string(str,len);
    bVar5 = radix == 0x10;
  }
  else {
    bVar5 = false;
  }
  if (radix == 10) {
    iVar1 = precision_from_string(str,len);
    return iVar1;
  }
  local_38 = 0.0;
  if (len != 0) {
    do {
      wVar2 = utf8_ptr::s_getch(str);
      if ((0x7f < (uint)wVar2) || (iVar1 = isspace(wVar2), iVar1 == 0)) {
        wVar2 = utf8_ptr::s_getch(str);
        if ((wVar2 == L'-') || (wVar2 = utf8_ptr::s_getch(str), p = (byte *)str, wVar2 == L'+')) {
          p = (byte *)str +
              (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1;
          len = (size_t)((byte *)str + (len - (long)p));
        }
        if ((byte *)len != (byte *)0x0) goto LAB_002360b3;
        break;
      }
      len = (size_t)((byte *)str +
                    (len - (long)((byte *)str +
                                 (ulong)((((byte)*str >> 5 & 1) != 0) + 1 &
                                        (uint)((byte)*str >> 7) * 3) + 1)));
      str = (char *)((byte *)str +
                    (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1);
    } while ((byte *)len != (byte *)0x0);
  }
  goto LAB_002361f7;
  while( true ) {
    len = (size_t)(p + (len - (long)(p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1
                                    )));
    p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
    if ((byte *)len == (byte *)0x0) break;
LAB_002360b3:
    wVar2 = utf8_ptr::s_getch((char *)p);
    if ((0x7f < (uint)wVar2) || (iVar1 = isspace(wVar2), iVar1 == 0)) {
      p_00 = p;
      if (((bVar5) && (wVar2 = utf8_ptr::s_getch((char *)p), wVar2 == L'0')) &&
         ((wVar2 = utf8_ptr::s_getch_at((char *)p,1), wVar2 == L'x' ||
          (wVar2 = utf8_ptr::s_getch_at((char *)p,1), wVar2 == L'X')))) {
        uVar3 = (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3);
        p_00 = p + (((p[uVar3 + 1] >> 5 & 1) != 0) + 1 & (uint)(p[uVar3 + 1] >> 7) * 3) + uVar3 + 2;
        len = (size_t)(p + (len - (long)p_00));
      }
      if ((byte *)len != (byte *)0x0) {
        bVar5 = false;
        iVar1 = 0;
        goto LAB_00236186;
      }
      break;
    }
  }
  goto LAB_002361f7;
  while( true ) {
    if (radix <= (int)uVar4) break;
    if (wVar2 != L'0') {
      bVar5 = true;
    }
    iVar1 = (iVar1 + 1) - (uint)!bVar5;
    len = (size_t)(p_00 + (len - (long)(p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 &
                                                      (uint)(*p_00 >> 7) * 3) + 1)));
    p_00 = p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1;
    if ((byte *)len == (byte *)0x0) break;
LAB_00236186:
    wVar2 = utf8_ptr::s_getch((char *)p_00);
    uVar4 = wVar2 + L'\xffffffd0';
    if (9 < uVar4) {
      if ((uint)(wVar2 + L'\xffffffbf') < 0x1a) {
        uVar4 = wVar2 + L'\xffffffc9';
      }
      else {
        if (0x19 < (uint)(wVar2 + L'\xffffff9f')) break;
        uVar4 = wVar2 + L'\xffffffa9';
      }
    }
  }
  local_38 = (double)iVar1;
LAB_002361f7:
  dVar6 = log10((double)radix);
  dVar6 = ceil(dVar6 * local_38);
  return (int)dVar6;
}

Assistant:

int CVmObjBigNum::precision_from_string(const char *str, size_t len, int radix)
{
    /* if the radix is zero, infer the radix from the string */
    int inferred_radix = 0;
    if (radix == 0)
        radix = inferred_radix = radix_from_string(str, len);

    /* for decimal values, parse the full floating point format */
    if (radix == 10)
        return precision_from_string(str, len);

    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* skip the sign if present */
    if (rem != 0 && (p.getch() == '-' || p.getch() == '+'))
        p.inc(&rem);

    /* skip more spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* if we inferred the radix as hax, skip any '0x' marker */
    if (inferred_radix == 16
        && rem != 0
        && p.getch() == '0'
        && (p.getch_at(1) == 'x' || p.getch_at(1) == 'X'))
    {
        /* skip the '0x' prefix */
        p.inc(&rem);
        p.inc(&rem);
    }

    /* scan digits */
    int prec, significant = FALSE;
    for (prec = 0 ; rem != 0 ; p.inc(&rem))
    {
        /* get this character */
        wchar_t ch = p.getch();

        /* get the digit value of this character */
        int d;
        if (ch >= '0' && ch <= '9')
            d = ch - '0';
        else if (ch >= 'A' && ch <= 'Z')
            d = ch - 'A' + 10;
        else if (ch >= 'a' && ch <= 'z')
            d = ch - 'a' + 10;
        else
            break;

        /* if the digit isn't within the radix, it's not a digit after all */
        if (d >= radix)
            break;

        /* it's significant if it's not a leading zero */
        if (ch != '0')
            significant = TRUE;

        /* 
         *   if we have found a significant digit so far, count this one - do
         *   not count leading zeros, whether they occur before or after the
         *   decimal point 
         */
        if (significant)
            ++prec;
    }

    /*
     *   Figure the decimal precision required to hold a number in the given
     *   radix.  This is a simple linear conversion: N base-R digits require
     *   log(R)/log(10) decimal digits.  Using log10 as our canonical log
     *   base means that log(R)/log(10) == log(R)/1 == log(R).  We of course
     *   have to round up for any fractional digits.
     */
    return (int)ceil(prec * log10((double)radix));
}